

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O2

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
Assimp::FBX::FBXConverter::ConvertMeshMultiMaterial
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          FBXConverter *this,MeshGeometry *mesh,Model *model,aiMatrix4x4 *node_global_transform,
          aiNode *nd)

{
  _Rb_tree_header *p_Var1;
  pointer piVar2;
  MatIndexArray *pMVar3;
  iterator iVar4;
  const_iterator __end2;
  const_iterator __begin2;
  pointer piVar5;
  value_type_conflict3 index;
  set<int,_std::less<int>,_std::allocator<int>_> had;
  value_type_conflict3 local_94;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_90;
  uint local_84;
  FBXConverter *local_80;
  Model *local_78;
  aiMatrix4x4 *local_70;
  aiNode *local_68;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  local_80 = this;
  local_78 = model;
  local_70 = node_global_transform;
  local_68 = nd;
  pMVar3 = MeshGeometry::GetMaterialIndices(mesh);
  piVar5 = (pMVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar2 = (pMVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (piVar2 != piVar5) {
    p_Var1 = &local_60._M_impl.super__Rb_tree_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_90 = __return_storage_ptr__;
    local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    for (; piVar5 != piVar2; piVar5 = piVar5 + 1) {
      local_94 = *piVar5;
      iVar4 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
              find(&local_60,&local_94);
      if ((_Rb_tree_header *)iVar4._M_node == p_Var1) {
        local_84 = ConvertMeshMultiMaterial(local_80,mesh,local_78,local_94,local_70,local_68);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (local_90,&local_84);
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>
                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   &local_60,&local_94);
      }
    }
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&local_60);
    return local_90;
  }
  __assert_fail("mindices.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                ,0x4c0,
                "std::vector<unsigned int> Assimp::FBX::FBXConverter::ConvertMeshMultiMaterial(const MeshGeometry &, const Model &, const aiMatrix4x4 &, aiNode &)"
               );
}

Assistant:

std::vector<unsigned int> FBXConverter::ConvertMeshMultiMaterial(const MeshGeometry& mesh, const Model& model,
            const aiMatrix4x4& node_global_transform, aiNode& nd)
        {
            const MatIndexArray& mindices = mesh.GetMaterialIndices();
            ai_assert(mindices.size());

            std::set<MatIndexArray::value_type> had;
            std::vector<unsigned int> indices;

            for (MatIndexArray::value_type index : mindices) {
                if (had.find(index) == had.end()) {

                    indices.push_back(ConvertMeshMultiMaterial(mesh, model, index, node_global_transform, nd));
                    had.insert(index);
                }
            }

            return indices;
        }